

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChromaticities.cpp
# Opt level: O1

M44f * Imf_3_2::RGBtoXYZ(M44f *__return_storage_ptr__,Chromaticities *chroma,float Y)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  uint uVar2;
  invalid_argument *this;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar5 = (chroma->white).y;
  if (ABS(fVar5) <= 1.0) {
    if (ABS(fVar5) * 3.4028235e+38 <= ABS((chroma->white).x * Y)) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Bad chromaticities: white.y cannot be zero");
      goto LAB_00157730;
    }
  }
  fVar6 = (chroma->white).x;
  auVar13._0_4_ = fVar6 * Y;
  auVar13._4_4_ = ((1.0 - fVar6) - fVar5) * Y;
  auVar13._8_4_ = Y * 0.0;
  auVar13._12_4_ = Y * 0.0;
  auVar14._4_4_ = fVar5;
  auVar14._0_4_ = fVar5;
  auVar14._8_4_ = fVar5;
  auVar14._12_4_ = fVar5;
  auVar14 = divps(auVar13,auVar14);
  fVar6 = (chroma->blue).x;
  fVar7 = (chroma->blue).y;
  fVar11 = (chroma->red).x;
  fVar12 = (chroma->red).y;
  fVar9 = (chroma->green).x;
  fVar10 = (chroma->green).y;
  fVar8 = auVar14._0_4_;
  fVar15 = auVar14._4_4_ + fVar8;
  fVar16 = (fVar7 + -1.0) * Y + fVar7 * fVar15;
  fVar5 = fVar9 * (fVar12 - fVar7) + (fVar7 - fVar10) * fVar11 + fVar6 * (fVar10 - fVar12);
  fVar17 = (fVar12 + -1.0) * Y + fVar15 * fVar12;
  fVar18 = (fVar10 + -1.0) * Y + fVar15 * fVar10;
  fVar15 = -fVar6 * fVar17 + fVar8 * (fVar12 - fVar7) + fVar16 * fVar11;
  fVar16 = fVar6 * fVar18 + fVar8 * (fVar7 - fVar10) + fVar16 * -fVar9;
  fVar8 = ((fVar10 - fVar12) * fVar8 - fVar18 * fVar11) + fVar9 * fVar17;
  if (ABS(fVar5) < 1.0) {
    fVar17 = ABS(fVar5) * 3.4028235e+38;
    iVar3 = -(uint)(ABS(fVar15) < fVar17);
    iVar4 = -(uint)(ABS(fVar16) < fVar17);
    auVar1._4_4_ = iVar3;
    auVar1._0_4_ = iVar3;
    auVar1._8_4_ = iVar4;
    auVar1._12_4_ = iVar4;
    uVar2 = movmskpd(in_EAX,auVar1);
    if ((((uVar2 & 2) == 0) || ((uVar2 & 1) == 0)) || (fVar17 <= ABS(fVar8))) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this,"Bad chromaticities: RGBtoXYZ matrix is degenerate");
LAB_00157730:
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  fVar16 = fVar16 / fVar5;
  fVar15 = fVar15 / fVar5;
  fVar8 = fVar8 / fVar5;
  __return_storage_ptr__->x[0][0] = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
  __return_storage_ptr__->x[1][1] = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
  __return_storage_ptr__->x[3][3] = 1.0;
  *(ulong *)__return_storage_ptr__->x[0] = CONCAT44(fVar16 * fVar12,fVar16 * fVar11);
  __return_storage_ptr__->x[0][2] = ((1.0 - fVar11) - fVar12) * fVar16;
  *(ulong *)__return_storage_ptr__->x[1] = CONCAT44(fVar15 * fVar10,fVar15 * fVar9);
  __return_storage_ptr__->x[1][2] = ((1.0 - fVar9) - fVar10) * fVar15;
  *(ulong *)__return_storage_ptr__->x[2] = CONCAT44(fVar8 * fVar7,fVar8 * fVar6);
  __return_storage_ptr__->x[2][2] = ((1.0 - fVar6) - fVar7) * fVar8;
  return __return_storage_ptr__;
}

Assistant:

IMATH_NAMESPACE::M44f
RGBtoXYZ (const Chromaticities& chroma, float Y)
{
    //
    // For an explanation of how the color conversion matrix is derived,
    // see Roy Hall, "Illumination and Color in Computer Generated Imagery",
    // Springer-Verlag, 1989, chapter 3, "Perceptual Response"; and
    // Charles A. Poynton, "A Technical Introduction to Digital Video",
    // John Wiley & Sons, 1996, chapter 7, "Color science for video".
    //

    //
    // X and Z values of RGB value (1, 1, 1), or "white"
    //

    // prevent a division that rounds to zero
    if (std::abs (chroma.white.y) <= 1.f &&
        std::abs (chroma.white.x * Y) >= std::abs (chroma.white.y) * FLT_MAX)
    {
        throw std::invalid_argument (
            "Bad chromaticities: white.y cannot be zero");
    }

    float X = chroma.white.x * Y / chroma.white.y;
    float Z = (1 - chroma.white.x - chroma.white.y) * Y / chroma.white.y;

    //
    // Scale factors for matrix rows, compute numerators and common denominator
    //

    float d = chroma.red.x * (chroma.blue.y - chroma.green.y) +
              chroma.blue.x * (chroma.green.y - chroma.red.y) +
              chroma.green.x * (chroma.red.y - chroma.blue.y);

    float SrN =
        (X * (chroma.blue.y - chroma.green.y) -
         chroma.green.x * (Y * (chroma.blue.y - 1) + chroma.blue.y * (X + Z)) +
         chroma.blue.x * (Y * (chroma.green.y - 1) + chroma.green.y * (X + Z)));

    float SgN =
        (X * (chroma.red.y - chroma.blue.y) +
         chroma.red.x * (Y * (chroma.blue.y - 1) + chroma.blue.y * (X + Z)) -
         chroma.blue.x * (Y * (chroma.red.y - 1) + chroma.red.y * (X + Z)));

    float SbN =
        (X * (chroma.green.y - chroma.red.y) -
         chroma.red.x * (Y * (chroma.green.y - 1) + chroma.green.y * (X + Z)) +
         chroma.green.x * (Y * (chroma.red.y - 1) + chroma.red.y * (X + Z)));

    if (std::abs (d) < 1.f && (std::abs (SrN) >= std::abs (d) * FLT_MAX ||
                               std::abs (SgN) >= std::abs (d) * FLT_MAX ||
                               std::abs (SbN) >= std::abs (d) * FLT_MAX))
    {
        // cannot generate matrix if all RGB primaries have the same y value
        // or if they all have the an x value of zero
        // in both cases, the primaries are colinear, which makes them unusable
        throw std::invalid_argument (
            "Bad chromaticities: RGBtoXYZ matrix is degenerate");
    }

    float Sr = SrN / d;
    float Sg = SgN / d;
    float Sb = SbN / d;

    //
    // Assemble the matrix
    //

    IMATH_NAMESPACE::M44f M;

    M[0][0] = Sr * chroma.red.x;
    M[0][1] = Sr * chroma.red.y;
    M[0][2] = Sr * (1 - chroma.red.x - chroma.red.y);

    M[1][0] = Sg * chroma.green.x;
    M[1][1] = Sg * chroma.green.y;
    M[1][2] = Sg * (1 - chroma.green.x - chroma.green.y);

    M[2][0] = Sb * chroma.blue.x;
    M[2][1] = Sb * chroma.blue.y;
    M[2][2] = Sb * (1 - chroma.blue.x - chroma.blue.y);

    return M;
}